

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

Error asmjit::v1_14::VirtMem::mapMemory
                (void **p,size_t size,MemoryFlags memoryFlags,int fd,off_t offset)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  Error EVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *__addr;
  int *piVar8;
  int in_ECX;
  MemoryFlags in_EDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  __off_t in_R8;
  void *ptr;
  uint lpSizeLog2;
  size_t lpSize;
  bool useLargePages;
  int mmFlags;
  int protection;
  MemoryFlags in_stack_ffffffffffffff80;
  uint local_60;
  Error local_34;
  size_t local_20;
  size_t local_18;
  size_t *local_10;
  size_t *local_8;
  
  *in_RDI = 0;
  if (in_RSI == 0) {
    EVar4 = DebugUtils::errored(2);
    return EVar4;
  }
  uVar5 = mmProtFromMemoryFlags(kNone);
  uVar6 = mmMaxProtFromMemoryFlags(in_stack_ffffffffffffff80);
  uVar7 = mmMapJitFromMemoryFlags(in_EDX);
  bVar3 = Support::test<asmjit::v1_14::VirtMem::MemoryFlags,asmjit::v1_14::VirtMem::MemoryFlags>
                    (in_EDX,kMapShared);
  local_60 = 2;
  if (bVar3) {
    local_60 = 1;
  }
  local_60 = local_60 | uVar7;
  if (in_ECX == -1) {
    local_60 = local_60 | 0x20;
  }
  bVar3 = Support::test<asmjit::v1_14::VirtMem::MemoryFlags,asmjit::v1_14::VirtMem::MemoryFlags>
                    (in_EDX,kMMapLargePages);
  if (bVar3) {
    local_20 = largePageSize();
    if (local_20 == 0) {
      EVar4 = DebugUtils::errored(7);
      return EVar4;
    }
    if (in_RSI % local_20 != 0) {
      EVar4 = DebugUtils::errored(2);
      return EVar4;
    }
    local_8 = &local_18;
    local_10 = &local_20;
    iVar1 = 0;
    for (uVar2 = local_20; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    local_60 = iVar1 << 0x1a | 0x40000U | local_60;
    local_18 = local_20;
  }
  __addr = mmap((void *)0x0,in_RSI,uVar5 | uVar6,local_60,in_ECX,in_R8);
  if (__addr == (void *)0xffffffffffffffff) {
    piVar8 = __errno_location();
    EVar4 = asmjitErrorFromErrno(*piVar8);
    local_34 = DebugUtils::errored(EVar4);
  }
  else {
    if (bVar3) {
      madvise(__addr,in_RSI,0xe);
    }
    *in_RDI = __addr;
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static Error mapMemory(void** p, size_t size, MemoryFlags memoryFlags, int fd = -1, off_t offset = 0) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = mmProtFromMemoryFlags(memoryFlags) | mmMaxProtFromMemoryFlags(memoryFlags);
  int mmFlags = mmMapJitFromMemoryFlags(memoryFlags);

  mmFlags |= Support::test(memoryFlags, MemoryFlags::kMapShared) ? MAP_SHARED : MAP_PRIVATE;
  if (fd == -1)
    mmFlags |= MAP_ANONYMOUS;

  bool useLargePages = Support::test(memoryFlags, VirtMem::MemoryFlags::kMMapLargePages);

  if (useLargePages) {
#if defined(__linux__)
    size_t lpSize = largePageSize();
    if (lpSize == 0)
      return DebugUtils::errored(kErrorFeatureNotEnabled);

    if (!Support::isAligned(size, lpSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    unsigned lpSizeLog2 = Support::ctz(lpSize);
    mmFlags |= int(unsigned(MAP_HUGETLB) | (lpSizeLog2 << MAP_HUGE_SHIFT));
#else
    return DebugUtils::errored(kErrorFeatureNotEnabled);
#endif // __linux__
  }

  void* ptr = mmap(nullptr, size, protection, mmFlags, fd, offset);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(asmjitErrorFromErrno(errno));

#if defined(MADV_HUGEPAGE)
  if (useLargePages) {
    madvise(ptr, size, MADV_HUGEPAGE);
  }
#endif

  *p = ptr;
  return kErrorOk;
}